

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

RGB __thiscall pbrt::MIPMap::Lookup<pbrt::RGB>(MIPMap *this,Point2f *st,Vector2f dst0,Vector2f dst1)

{
  undefined8 uVar1;
  size_t sVar2;
  float *pfVar3;
  long lVar4;
  int level;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar11;
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  Tuple2<pbrt::Vector2,_float> dst1_00;
  RGB RVar15;
  RGB RVar16;
  RGB RVar17;
  Vector2f local_68;
  float local_48;
  float fStack_44;
  undefined1 local_28 [16];
  
  auVar13._8_56_ = in_register_00001248;
  auVar13._0_8_ = dst1.super_Tuple2<pbrt::Vector2,_float>;
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = dst0.super_Tuple2<pbrt::Vector2,_float>;
  auVar7 = auVar10._0_16_;
  auVar5 = auVar13._0_16_;
  if ((this->options).filter != EWA) {
    auVar5 = vmovlhps_avx(auVar7,auVar5);
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx512vl(auVar5,auVar7);
    pfVar3 = (float *)local_28;
    lVar4 = 4;
    local_28 = auVar5;
    do {
      fVar11 = *(float *)(local_28 + lVar4);
      fVar6 = auVar5._0_4_;
      auVar5 = vmaxss_avx(ZEXT416((uint)fVar11),auVar5);
      if (fVar6 < fVar11) {
        pfVar3 = (float *)(local_28 + lVar4);
      }
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x10);
    RVar15 = Lookup<pbrt::RGB>(this,st,*pfVar3 + *pfVar3);
    return RVar15;
  }
  auVar8._0_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.x *
                 dst0.super_Tuple2<pbrt::Vector2,_float>.x;
  auVar8._4_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.y *
                 dst0.super_Tuple2<pbrt::Vector2,_float>.y;
  auVar8._8_4_ = in_register_00001208._0_4_ * in_register_00001208._0_4_;
  auVar8._12_4_ = in_register_00001208._4_4_ * in_register_00001208._4_4_;
  auVar14._0_4_ =
       dst1.super_Tuple2<pbrt::Vector2,_float>.x * dst1.super_Tuple2<pbrt::Vector2,_float>.x;
  auVar14._4_4_ =
       dst1.super_Tuple2<pbrt::Vector2,_float>.y * dst1.super_Tuple2<pbrt::Vector2,_float>.y;
  auVar14._8_4_ = in_register_00001248._0_4_ * in_register_00001248._0_4_;
  auVar14._12_4_ = in_register_00001248._4_4_ * in_register_00001248._4_4_;
  auVar8 = vhaddps_avx(auVar8,auVar8);
  auVar14 = vhaddps_avx(auVar14,auVar14);
  auVar12 = auVar7;
  if (auVar14._0_4_ <= auVar8._0_4_) {
    auVar12 = auVar5;
    auVar5 = auVar7;
  }
  dst1_00 = auVar12._0_8_;
  auVar7 = vinsertps_avx(auVar12,auVar5,0x1c);
  auVar8 = vinsertps_avx(auVar5,auVar12,0x4c);
  auVar9._0_4_ = auVar7._0_4_ * auVar7._0_4_ + auVar8._0_4_ * auVar8._0_4_;
  auVar9._4_4_ = auVar7._4_4_ * auVar7._4_4_ + auVar8._4_4_ * auVar8._4_4_;
  auVar9._8_4_ = auVar7._8_4_ * auVar7._8_4_ + auVar8._8_4_ * auVar8._8_4_;
  auVar9._12_4_ = auVar7._12_4_ * auVar7._12_4_ + auVar8._12_4_ * auVar8._12_4_;
  auVar8 = vsqrtps_avx(auVar9);
  fVar6 = auVar8._0_4_;
  fVar11 = fVar6 * (this->options).maxAnisotropy;
  auVar7 = vinsertps_avx(auVar8,ZEXT416((uint)fVar11),0x1d);
  uVar1 = vcmpps_avx512vl(auVar7,auVar8,1);
  if ((~(ushort)uVar1 & 3) == 0) {
    auVar7 = vmovshdup_avx(auVar8);
    fVar11 = auVar7._0_4_ / fVar11;
    fVar6 = fVar6 * fVar11;
    dst1_00.x = auVar12._0_4_ * fVar11;
    dst1_00.y = auVar12._4_4_ * fVar11;
  }
  if ((fVar6 == 0.0) && (!NAN(fVar6))) {
    RVar15 = Bilerp<pbrt::RGB>(this,0,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
    return RVar15;
  }
  sVar2 = (this->pyramid).nStored;
  fVar11 = logf(fVar6);
  auVar8 = vmaxss_avx(ZEXT416((uint)(fVar11 * 1.442695 + (float)((int)sVar2 + -1))),ZEXT416(0));
  auVar7 = vroundss_avx(auVar8,auVar8,9);
  level = (int)auVar7._0_4_;
  auVar12._0_4_ = (int)auVar7._0_4_;
  auVar12._4_4_ = (int)auVar7._4_4_;
  auVar12._8_4_ = (int)auVar7._8_4_;
  auVar12._12_4_ = (int)auVar7._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar12);
  fVar11 = auVar8._0_4_ - auVar7._0_4_;
  fVar6 = 1.0 - fVar11;
  local_68.super_Tuple2<pbrt::Vector2,_float> = auVar5._0_8_;
  RVar15 = EWA<pbrt::RGB>(this,level,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_68,
                          (Vector2f)dst1_00);
  RVar16 = EWA<pbrt::RGB>(this,level + 1,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_68,
                          (Vector2f)dst1_00);
  local_48 = RVar15.r;
  fStack_44 = RVar15.g;
  RVar17.r = RVar16.r * fVar11 + fVar6 * local_48;
  RVar17.g = RVar16.g * fVar11 + fVar6 * fStack_44;
  RVar17.b = RVar16.b * fVar11 + RVar15.b * fVar6;
  return RVar17;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        Float width = std::max(
            {std::abs(dst0[0]), std::abs(dst0[1]), std::abs(dst1[0]), std::abs(dst1[1])});
        return Lookup<T>(st, 2 * width);
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0);
    Float minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    // TODO: just do return EWA<T>(ilog, st, dst0, dst1);
    // TODO: also, when scaling camera ray differentials, just do e.g.
    // 1 / std::min(sqrtSamplesPerPixel, 8);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}